

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool P_UseTraverse(AActor *usething,DVector2 *start,DVector2 *end,bool *foundline)

{
  double a;
  double b;
  line_t *linedef;
  uint uVar1;
  int iVar2;
  ASectorAction *pAVar3;
  bool bVar4;
  double c;
  sector_t *local_1c0;
  TVector2<double> local_178;
  FSoundID local_164;
  TVector2<double> local_160;
  sector_t *local_150;
  sector_t *sec;
  undefined1 local_138 [8];
  FLineOpening open;
  TFlags<ActorFlag5,_unsigned_int> local_a0 [4];
  undefined1 local_90 [8];
  DVector3 xpos;
  intercept_t *in;
  FPathTraverse it;
  bool *foundline_local;
  DVector2 *end_local;
  DVector2 *start_local;
  AActor *usething_local;
  
  it._56_8_ = foundline;
  FPathTraverse::FPathTraverse((FPathTraverse *)&in,start->X,start->Y,end->X,end->Y,3,0.0);
  a = start->X;
  b = start->Y;
  c = AActor::Z(usething);
  TVector3<double>::TVector3((TVector3<double> *)local_90,a,b,c);
LAB_0067c28e:
  do {
    do {
      while( true ) {
        xpos.Z = (double)FPathTraverse::Next((FPathTraverse *)&in);
        if ((intercept_t *)xpos.Z == (intercept_t *)0x0) {
          usething_local._7_1_ = false;
          goto LAB_0067c7b9;
        }
        if ((((intercept_t *)xpos.Z)->isaline & 1U) != 0) break;
        if (usething != (((intercept_t *)xpos.Z)->d).thing) {
          TFlags<ActorFlag5,_unsigned_int>::operator&
                    (local_a0,SUB84(((intercept_t *)xpos.Z)->d,0) +
                              (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|
                              MF5_NODROPOFF));
          uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)local_a0);
          bVar4 = true;
          if (uVar1 == 0) {
            bVar4 = *(int *)(*(long *)((long)xpos.Z + 0x10) + 0x264) == 0x81;
          }
          if ((bVar4) &&
             (bVar4 = P_ActivateThingSpecial(*(AActor **)((long)xpos.Z + 0x10),usething,false),
             bVar4)) {
            usething_local._7_1_ = true;
LAB_0067c7b9:
            open.touchmidtex = true;
            open.abovemidtex = false;
            open._142_2_ = 0;
            FPathTraverse::~FPathTraverse((FPathTraverse *)&in);
            return usething_local._7_1_;
          }
        }
      }
      iVar2 = FPathTraverse::PortalRelocate
                        ((FPathTraverse *)&in,(intercept_t *)xpos.Z,3,(DVector3 *)local_90);
    } while (iVar2 != 0);
    FLineOpening::FLineOpening((FLineOpening *)local_138);
    if ((*(int *)(*(long *)((long)xpos.Z + 0x10) + 0x28) != 0) &&
       ((*(uint *)(*(long *)((long)xpos.Z + 0x10) + 0x24) & 0x442) != 0)) {
      TVector2<double>::TVector2(&local_178,(TVector3<double> *)local_90);
      iVar2 = P_PointOnLineSide(&local_178,*(line_t **)((long)xpos.Z + 0x10));
      if (iVar2 == 1) {
        if ((*(uint *)(*(long *)((long)xpos.Z + 0x10) + 0x24) & 0x400) != 0) {
          P_ActivateLine(*(line_t **)((long)xpos.Z + 0x10),usething,1,0x400,(DVector3 *)local_90);
          usething_local._7_1_ = true;
          goto LAB_0067c7b9;
        }
      }
      else if ((*(uint *)(*(long *)((long)xpos.Z + 0x10) + 0x24) & 0x442) != 0x400) {
        P_ActivateLine(*(line_t **)((long)xpos.Z + 0x10),usething,0,2,(DVector3 *)local_90);
        if ((i_compatflags & 0x100U) == 0) {
          if ((*(uint *)(*(long *)((long)xpos.Z + 0x10) + 0x24) & 2) != 0) {
            usething_local._7_1_ = true;
            goto LAB_0067c7b9;
          }
        }
        else if ((*(uint *)(*(long *)((long)xpos.Z + 0x10) + 0x24) & 0x40) == 0) {
          usething_local._7_1_ = true;
          goto LAB_0067c7b9;
        }
        goto LAB_0067c28e;
      }
    }
    if ((*(uint *)(*(long *)((long)xpos.Z + 0x10) + 0x20) & 0x2008000) == 0) {
      linedef = *(line_t **)((long)xpos.Z + 0x10);
      FPathTraverse::InterceptPoint((FPathTraverse *)&sec,(intercept_t *)&in);
      P_LineOpening((FLineOpening *)local_138,(AActor *)0x0,linedef,(DVector2 *)&sec,(DVector2 *)0x0
                    ,0);
    }
    else {
      open.bottom = 0.0;
    }
    if ((open.bottom <= 0.0) ||
       ((*(int *)(*(long *)((long)xpos.Z + 0x10) + 0x28) != 0 && ((i_compatflags & 0x100U) != 0))))
    {
      local_150 = usething->Sector;
      pAVar3 = TObjPtr::operator_cast_to_ASectorAction_((TObjPtr *)&local_150->SecActTarget);
      if (pAVar3 != (ASectorAction *)0x0) {
        pAVar3 = TObjPtr<ASectorAction>::operator->(&local_150->SecActTarget);
        bVar4 = ASectorAction::TriggerAction(pAVar3,usething,0x10);
        if (bVar4) {
          usething_local._7_1_ = true;
          goto LAB_0067c7b9;
        }
      }
      TVector2<double>::TVector2(&local_160,(TVector3<double> *)local_90);
      iVar2 = P_PointOnLineSide(&local_160,*(line_t **)((long)xpos.Z + 0x10));
      if (iVar2 == 0) {
        local_1c0 = *(sector_t **)(*(long *)((long)xpos.Z + 0x10) + 0x78);
      }
      else {
        local_1c0 = *(sector_t **)(*(long *)((long)xpos.Z + 0x10) + 0x80);
      }
      local_150 = local_1c0;
      if ((local_1c0 != (sector_t *)0x0) &&
         (pAVar3 = TObjPtr::operator_cast_to_ASectorAction_((TObjPtr *)&local_1c0->SecActTarget),
         pAVar3 != (ASectorAction *)0x0)) {
        pAVar3 = TObjPtr<ASectorAction>::operator->(&local_150->SecActTarget);
        bVar4 = ASectorAction::TriggerAction(pAVar3,usething,0x20);
        if (bVar4) {
          usething_local._7_1_ = true;
          goto LAB_0067c7b9;
        }
      }
      if (usething->player != (player_t *)0x0) {
        FSoundID::FSoundID(&local_164,"*usefail");
        S_Sound(usething,2,&local_164,1.0,1.001);
      }
      usething_local._7_1_ = true;
      goto LAB_0067c7b9;
    }
    *(undefined1 *)it._56_8_ = 1;
  } while( true );
}

Assistant:

bool P_UseTraverse(AActor *usething, const DVector2 &start, const DVector2 &end, bool &foundline)
{
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES | PT_ADDTHINGS);
	intercept_t *in;
	DVector3 xpos = { start.X, start.Y, usething->Z() };

	while ((in = it.Next()))
	{
		// [RH] Check for things to talk with or use a puzzle item on
		if (!in->isaline)
		{
			if (usething == in->d.thing)
				continue;
			// Check thing

			// Check for puzzle item use or USESPECIAL flag
			// Extended to use the same activationtype mechanism as BUMPSPECIAL does
			if (in->d.thing->flags5 & MF5_USESPECIAL || in->d.thing->special == UsePuzzleItem)
			{
				if (P_ActivateThingSpecial(in->d.thing, usething))
					return true;
			}
			continue;
		}

		if (it.PortalRelocate(in, PT_ADDLINES | PT_ADDTHINGS, &xpos))
		{
			continue;
		}

		FLineOpening open;
		if (in->d.line->special == 0 || !(in->d.line->activation & (SPAC_Use | SPAC_UseThrough | SPAC_UseBack)))
		{
		blocked:
			if (in->d.line->flags & (ML_BLOCKEVERYTHING | ML_BLOCKUSE))
			{
				open.range = 0;
			}
			else
			{
				P_LineOpening(open, NULL, in->d.line, it.InterceptPoint(in));
			}
			if (open.range <= 0 ||
				(in->d.line->special != 0 && (i_compatflags & COMPATF_USEBLOCKING)))
			{
				// [RH] Give sector a chance to intercept the use

				sector_t * sec;

				sec = usething->Sector;

				if (sec->SecActTarget && sec->SecActTarget->TriggerAction(usething, SECSPAC_Use))
				{
					return true;
				}

				sec = P_PointOnLineSide(xpos, in->d.line) == 0 ?
					in->d.line->frontsector : in->d.line->backsector;

				if (sec != NULL && sec->SecActTarget &&
					sec->SecActTarget->TriggerAction(usething, SECSPAC_UseWall))
				{
					return true;
				}

				if (usething->player)
				{
					S_Sound(usething, CHAN_VOICE, "*usefail", 1, ATTN_IDLE);
				}
				return true;		// can't use through a wall
			}
			foundline = true;
			continue;			// not a special line, but keep checking
		}

		if (P_PointOnLineSide(xpos, in->d.line) == 1)
		{
			if (!(in->d.line->activation & SPAC_UseBack))
			{
				// [RH] continue traversal for two-sided lines
				//return in->d.line->backsector != NULL;		// don't use back side
				goto blocked;	// do a proper check for back sides of triggers
			}
			else
			{
				P_ActivateLine(in->d.line, usething, 1, SPAC_UseBack, &xpos);
				return true;
			}
		}
		else
		{
			if ((in->d.line->activation & (SPAC_Use | SPAC_UseThrough | SPAC_UseBack)) == SPAC_UseBack)
			{
				goto blocked; // Line cannot be used from front side so treat it as a non-trigger line
			}

			P_ActivateLine(in->d.line, usething, 0, SPAC_Use, &xpos);

			//WAS can't use more than one special line in a row
			//jff 3/21/98 NOW multiple use allowed with enabling line flag
			//[RH] And now I've changed it again. If the line is of type
			//	   SPAC_USE, then it eats the use. Everything else passes
			//	   it through, including SPAC_USETHROUGH.
			if (i_compatflags & COMPATF_USEBLOCKING)
			{
				if (in->d.line->activation & SPAC_UseThrough) continue;
				else return true;
			}
			else
			{
				if (!(in->d.line->activation & SPAC_Use)) continue;
				else return true;
			}

		}

	}
	return false;
}